

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_fragment.cpp
# Opt level: O1

ON_RTree * __thiscall ON_SubDMeshImpl::FragmentTree(ON_SubDMeshImpl *this)

{
  ON_RTree *pOVar1;
  ON_SubDMeshFragment *a_element_id;
  
  if ((this->m_fragment_tree != (ON_RTree *)0x0) &&
     (this->m_first_fragment != (ON_SubDMeshFragment *)0x0)) {
    pOVar1 = (ON_RTree *)operator_new(0x48);
    ON_RTree::ON_RTree(pOVar1,0);
    for (a_element_id = this->m_first_fragment; a_element_id != (ON_SubDMeshFragment *)0x0;
        a_element_id = a_element_id->m_next_fragment) {
      if (((a_element_id->m_P != (double *)0x0) && (2 < a_element_id->m_P_stride)) &&
         ((a_element_id->m_vertex_count_etc & 0x1fff) != 0)) {
        ON_RTree::Insert(pOVar1,(double *)&a_element_id->m_surface_bbox,
                         &(a_element_id->m_surface_bbox).m_max.x,a_element_id);
      }
    }
    this->m_fragment_tree = pOVar1;
  }
  pOVar1 = this->m_fragment_tree;
  if (pOVar1 == (ON_RTree *)0x0) {
    pOVar1 = &ON_RTree::Empty;
  }
  return pOVar1;
}

Assistant:

const ON_RTree& ON_SubDMeshImpl::FragmentTree() const
{
  if (nullptr != m_fragment_tree && nullptr != m_first_fragment)
  {
    ON_RTree* fragment_tree = new ON_RTree();
    for (const ON_SubDMeshFragment* fragment = m_first_fragment; nullptr != fragment; fragment = fragment->m_next_fragment)
    {
      if (fragment->PointCount() > 0 )
        fragment_tree->Insert(&(fragment->m_surface_bbox.m_min.x), &(fragment->m_surface_bbox.m_max.x), (void*)fragment);
    }
    const_cast< ON_SubDMeshImpl* >(this)->m_fragment_tree = fragment_tree;
  }
  return (nullptr == m_fragment_tree ) ? ON_RTree::Empty : *m_fragment_tree;
}